

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayout::addAnchors
          (QGraphicsAnchorLayout *this,QGraphicsLayoutItem *firstItem,
          QGraphicsLayoutItem *secondItem,Orientations orientations)

{
  QGraphicsAnchor *pQVar1;
  bool bVar2;
  
  bVar2 = true;
  if (((uint)orientations.super_QFlagsStorageHelper<Qt::Orientation,_4>.
             super_QFlagsStorage<Qt::Orientation>.i & 1) != 0) {
    pQVar1 = QGraphicsAnchorLayoutPrivate::addAnchor
                       ((QGraphicsAnchorLayoutPrivate *)
                        (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d,secondItem,
                        AnchorLeft,firstItem,AnchorLeft,(qreal *)0x0);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    bVar2 = pQVar1 != (QGraphicsAnchor *)0x0;
    if (bVar2) {
      QGraphicsAnchorLayoutPrivate::addAnchor
                ((QGraphicsAnchorLayoutPrivate *)
                 (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d,firstItem,
                 AnchorRight,secondItem,AnchorRight,(qreal *)0x0);
      (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
      bVar2 = true;
    }
  }
  if (!(bool)(bVar2 ^ 1U |
             ((uint)orientations.super_QFlagsStorageHelper<Qt::Orientation,_4>.
                    super_QFlagsStorage<Qt::Orientation>.i & 2) == 0)) {
    QGraphicsAnchorLayoutPrivate::addAnchor
              ((QGraphicsAnchorLayoutPrivate *)
               (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d,secondItem,AnchorTop,
               firstItem,AnchorTop,(qreal *)0x0);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    QGraphicsAnchorLayoutPrivate::addAnchor
              ((QGraphicsAnchorLayoutPrivate *)
               (this->super_QGraphicsLayout).super_QGraphicsLayoutItem.d_ptr.d,firstItem,
               AnchorBottom,secondItem,AnchorBottom,(qreal *)0x0);
    (*(this->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])(this);
    return;
  }
  return;
}

Assistant:

void QGraphicsAnchorLayout::addAnchors(QGraphicsLayoutItem *firstItem,
                                       QGraphicsLayoutItem *secondItem,
                                       Qt::Orientations orientations)
{
    bool ok = true;
    if (orientations & Qt::Horizontal) {
        // Currently, if the first is ok, then the rest of the calls should be ok
        ok = addAnchor(secondItem, Qt::AnchorLeft, firstItem, Qt::AnchorLeft) != nullptr;
        if (ok)
            addAnchor(firstItem, Qt::AnchorRight, secondItem, Qt::AnchorRight);
    }
    if (orientations & Qt::Vertical && ok) {
        addAnchor(secondItem, Qt::AnchorTop, firstItem, Qt::AnchorTop);
        addAnchor(firstItem, Qt::AnchorBottom, secondItem, Qt::AnchorBottom);
    }
}